

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertFromAPInt
          (DoubleAPFloat *this,APInt *Input,bool IsSigned,roundingMode RM)

{
  opStatus oVar1;
  undefined1 local_68 [36];
  opStatus local_44;
  undefined1 local_40 [4];
  opStatus Ret;
  APFloat Tmp;
  roundingMode RM_local;
  bool IsSigned_local;
  APInt *Input_local;
  DoubleAPFloat *this_local;
  
  Tmp.U._16_4_ = RM;
  Tmp.U._23_1_ = IsSigned;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x10d7,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::convertFromAPInt(const APInt &, bool, roundingMode)"
                 );
  }
  APFloat::APFloat((APFloat *)local_40,(fltSemantics *)semPPCDoubleDoubleLegacy);
  local_44 = APFloat::convertFromAPInt
                       ((APFloat *)local_40,Input,(bool)(Tmp.U._23_1_ & 1),Tmp.U._16_4_);
  APFloat::bitcastToAPInt((APFloat *)local_68);
  DoubleAPFloat((DoubleAPFloat *)(local_68 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                (APInt *)local_68);
  operator=(this,(DoubleAPFloat *)(local_68 + 0x10));
  ~DoubleAPFloat((DoubleAPFloat *)(local_68 + 0x10));
  APInt::~APInt((APInt *)local_68);
  oVar1 = local_44;
  APFloat::~APFloat((APFloat *)local_40);
  return oVar1;
}

Assistant:

APFloat::opStatus DoubleAPFloat::convertFromAPInt(const APInt &Input,
                                                  bool IsSigned,
                                                  roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.convertFromAPInt(Input, IsSigned, RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}